

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::ensure_member_packing_rules_msl
          (CompilerMSL *this,SPIRType *ib_type,uint32_t index)

{
  BaseType BVar1;
  bool bVar2;
  uint32_t uVar3;
  BaseType BVar4;
  TypedID *this_00;
  CompilerError *pCVar5;
  size_t sVar6;
  uint *puVar7;
  bool *pbVar8;
  uint local_364;
  bool local_351;
  bool local_345;
  uint local_344;
  bool local_33d;
  uint local_33c;
  uint32_t local_338;
  undefined1 local_331;
  SPIRType *pSStack_330;
  bool row_major_1;
  SPIRType *type;
  uint32_t local_320;
  uint32_t type_id;
  uint32_t type_id_2;
  SPIRType physical_type_1;
  bool row_major;
  uint32_t elems_per_stride_1;
  uint32_t matrix_stride;
  TypedID<(spirv_cross::Types)1> local_1ac;
  uint32_t type_id_1;
  SPIRType physical_type;
  uint32_t elems_per_stride;
  uint32_t mbr_width_in_bytes;
  uint local_48;
  uint local_44;
  uint32_t dim;
  uint32_t dimensions;
  uint32_t array_stride;
  bool local_29;
  SPIRType *pSStack_28;
  bool is_buff_ptr;
  SPIRType *mbr_type;
  SPIRType *pSStack_18;
  uint32_t index_local;
  SPIRType *ib_type_local;
  CompilerMSL *this_local;
  
  mbr_type._4_4_ = index;
  pSStack_18 = ib_type;
  ib_type_local = (SPIRType *)this;
  bVar2 = validate_member_packing_rules_msl(this,ib_type,index);
  if (!bVar2) {
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        (&(pSStack_18->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                         (ulong)mbr_type._4_4_);
    uVar3 = TypedID::operator_cast_to_unsigned_int(this_00);
    pSStack_28 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
    local_351 = false;
    if ((pSStack_28->pointer & 1U) != 0) {
      local_351 = pSStack_28->storage == StorageClassPhysicalStorageBuffer;
    }
    local_29 = local_351;
    if ((pSStack_28->basetype == Struct) && (local_351 == false)) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar5,
                 "Cannot perform any repacking for structs when it is used as a member of another struct."
                );
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar2 = Compiler::is_scalar((Compiler *)this,pSStack_18);
    if (!bVar2) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_18->super_IVariant).self);
      Compiler::set_extended_member_decoration
                ((Compiler *)this,uVar3,mbr_type._4_4_,SPIRVCrossDecorationPhysicalTypePacked,0);
    }
    bVar2 = validate_member_packing_rules_msl(this,pSStack_18,mbr_type._4_4_);
    if (!bVar2) {
      bVar2 = VectorView<unsigned_int>::empty(&(pSStack_28->array).super_VectorView<unsigned_int>);
      if ((bVar2) || (bVar2 = Compiler::is_matrix((Compiler *)this,pSStack_28), bVar2)) {
        bVar2 = Compiler::is_matrix((Compiler *)this,pSStack_28);
        if (!bVar2) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar5,"Found a buffer packing case which we cannot represent in MSL.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        uVar3 = Compiler::type_struct_member_matrix_stride
                          ((Compiler *)this,pSStack_18,mbr_type._4_4_);
        BVar4 = uVar3 / (pSStack_28->width >> 3);
        if (BVar4 == SByte) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar5,"Cannot use ArrayStride of 3 elements in remapping scenarios.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if ((UByte < BVar4) && (BVar4 != UInt)) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar5,"Cannot represent vectors with more than 4 elements in MSL.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (BVar4 == UInt) {
          if (pSStack_28->basetype != Half) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Unexpected type in std140 wide matrix stride resolve.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          add_spv_func_and_recompile(this,SPVFuncImplPaddedStd140);
        }
        physical_type_1.member_name_cache._M_h._M_single_bucket._4_4_ =
             TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_18->super_IVariant).self);
        bVar2 = Compiler::has_member_decoration
                          ((Compiler *)this,
                           (TypeID)physical_type_1.member_name_cache._M_h._M_single_bucket._4_4_,
                           mbr_type._4_4_,DecorationRowMajor);
        SPIRType::SPIRType((SPIRType *)&type_id_2,pSStack_28);
        TypedID<(spirv_cross::Types)1>::TypedID((TypedID<(spirv_cross::Types)1> *)&type_id,0);
        physical_type_1.image.access = type_id;
        BVar1 = BVar4;
        if (bVar2) {
          BVar1 = physical_type_1.basetype;
          physical_type_1.width = BVar4;
        }
        physical_type_1.basetype = BVar1;
        local_320 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
        Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                  ((Compiler *)this,local_320,(SPIRType *)&type_id_2);
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSStack_18->super_IVariant).self);
        Compiler::set_extended_member_decoration
                  ((Compiler *)this,uVar3,mbr_type._4_4_,SPIRVCrossDecorationPhysicalTypeID,
                   local_320);
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSStack_18->super_IVariant).self);
        Compiler::unset_extended_member_decoration
                  ((Compiler *)this,uVar3,mbr_type._4_4_,SPIRVCrossDecorationPhysicalTypePacked);
        SPIRType::~SPIRType((SPIRType *)&type_id_2);
      }
      else {
        dim = Compiler::type_struct_member_array_stride((Compiler *)this,pSStack_18,mbr_type._4_4_);
        sVar6 = VectorView<unsigned_int>::size(&(pSStack_28->array).super_VectorView<unsigned_int>);
        local_44 = (int)sVar6 - 1;
        for (local_48 = 0; local_48 < local_44; local_48 = local_48 + 1) {
          mbr_width_in_bytes =
               CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSStack_28,local_48);
          elems_per_stride = 1;
          puVar7 = ::std::max<unsigned_int>(&mbr_width_in_bytes,&elems_per_stride);
          dim = dim / *puVar7;
        }
        if ((local_29 & 1U) == 0) {
          local_364 = pSStack_28->width >> 3;
        }
        else {
          local_364 = 8;
        }
        physical_type.member_name_cache._M_h._M_single_bucket._4_4_ = local_364;
        physical_type.member_name_cache._M_h._M_single_bucket._0_4_ = dim / local_364;
        if ((BaseType)physical_type.member_name_cache._M_h._M_single_bucket == SByte) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar5,"Cannot use ArrayStride of 3 elements in remapping scenarios.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if ((UByte < (BaseType)physical_type.member_name_cache._M_h._M_single_bucket) &&
           ((BaseType)physical_type.member_name_cache._M_h._M_single_bucket != UInt)) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar5,"Cannot represent vectors with more than 4 elements in MSL.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if ((BaseType)physical_type.member_name_cache._M_h._M_single_bucket == UInt) {
          if (pSStack_28->width != 0x10) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar5,"Unexpected type in std140 wide array resolve.");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          add_spv_func_and_recompile(this,SPVFuncImplPaddedStd140);
        }
        SPIRType::SPIRType((SPIRType *)&type_id_1,pSStack_28);
        physical_type.basetype = (BaseType)physical_type.member_name_cache._M_h._M_single_bucket;
        TypedID<(spirv_cross::Types)1>::TypedID(&local_1ac,0);
        physical_type.image.access = local_1ac.id;
        if ((local_29 & 1U) != 0) {
          physical_type.super_IVariant._12_4_ = 0x40;
          physical_type.super_IVariant.self.id = to_unsigned_basetype(0x40);
          physical_type.array_size_literal.stack_storage.aligned_char[4] = '\0';
          physical_type.array_size_literal.stack_storage.aligned_char[0] = '\0';
          physical_type.array_size_literal.stack_storage.aligned_char[1] = '\0';
          physical_type.array_size_literal.stack_storage.aligned_char[2] = '\0';
          physical_type.array_size_literal.stack_storage.aligned_char[3] = '\0';
          physical_type.array_size_literal.stack_storage.aligned_char[5] = '\0';
        }
        matrix_stride = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1)
        ;
        Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                  ((Compiler *)this,matrix_stride,(SPIRType *)&type_id_1);
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSStack_18->super_IVariant).self);
        Compiler::set_extended_member_decoration
                  ((Compiler *)this,uVar3,mbr_type._4_4_,SPIRVCrossDecorationPhysicalTypeID,
                   matrix_stride);
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)&elems_per_stride_1,matrix_stride);
        Compiler::set_decoration((Compiler *)this,(ID)elems_per_stride_1,DecorationArrayStride,dim);
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSStack_18->super_IVariant).self);
        Compiler::unset_extended_member_decoration
                  ((Compiler *)this,uVar3,mbr_type._4_4_,SPIRVCrossDecorationPhysicalTypePacked);
        SPIRType::~SPIRType((SPIRType *)&type_id_1);
      }
      bVar2 = validate_member_packing_rules_msl(this,pSStack_18,mbr_type._4_4_);
      if (!bVar2) {
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSStack_18->super_IVariant).self);
        type._4_4_ = Compiler::get_extended_member_decoration
                               ((Compiler *)this,uVar3,mbr_type._4_4_,
                                SPIRVCrossDecorationPhysicalTypeID);
        pSStack_330 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type._4_4_);
        bVar2 = Compiler::is_array((Compiler *)this,pSStack_330);
        if (bVar2) {
          puVar7 = VectorView<unsigned_int>::back
                             (&(pSStack_330->array).super_VectorView<unsigned_int>);
          if (*puVar7 < 2) {
            uVar3 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSStack_18->super_IVariant).self);
            Compiler::unset_extended_member_decoration
                      ((Compiler *)this,uVar3,mbr_type._4_4_,SPIRVCrossDecorationPhysicalTypeID);
            uVar3 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSStack_18->super_IVariant).self);
            Compiler::set_extended_member_decoration
                      ((Compiler *)this,uVar3,mbr_type._4_4_,SPIRVCrossDecorationPhysicalTypePacked,
                       0);
          }
          else {
            pbVar8 = VectorView<bool>::back
                               (&(pSStack_330->array_size_literal).super_VectorView<bool>);
            if ((*pbVar8 & 1U) == 0) {
              pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (pCVar5,
                         "Cannot apply scalar layout workaround with spec constant array size.");
              __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            puVar7 = VectorView<unsigned_int>::back
                               (&(pSStack_330->array).super_VectorView<unsigned_int>);
            *puVar7 = *puVar7 - 1;
          }
        }
        else {
          bVar2 = Compiler::is_matrix((Compiler *)this,pSStack_330);
          if (bVar2) {
            local_338 = (uint32_t)
                        TypedID::operator_cast_to_TypedID
                                  ((TypedID *)&(pSStack_18->super_IVariant).self);
            local_331 = Compiler::has_member_decoration
                                  ((Compiler *)this,(TypeID)local_338,mbr_type._4_4_,
                                   DecorationRowMajor);
            if ((bool)local_331) {
              if (pSStack_330->vecsize < 3) {
                if (pSStack_330->vecsize == 2) {
                  pSStack_330->vecsize = pSStack_330->columns;
                  pSStack_330->columns = 1;
                  bVar2 = VectorView<unsigned_int>::empty
                                    (&(pSStack_330->array).super_VectorView<unsigned_int>);
                  if (!bVar2) {
                    __assert_fail("type.array.empty()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                                  ,0x139e,
                                  "void spirv_cross::CompilerMSL::ensure_member_packing_rules_msl(SPIRType &, uint32_t)"
                                 );
                  }
                  *(undefined4 *)&(pSStack_330->super_IVariant).field_0xc = 0x1c;
                  local_344 = 1;
                  SmallVector<unsigned_int,_8UL>::push_back(&pSStack_330->array,&local_344);
                  local_345 = true;
                  SmallVector<bool,_8UL>::push_back(&pSStack_330->array_size_literal,&local_345);
                }
              }
              else {
                pSStack_330->vecsize = pSStack_330->vecsize - 1;
              }
            }
            else if (pSStack_330->columns < 3) {
              if (pSStack_330->columns == 2) {
                pSStack_330->columns = 1;
                bVar2 = VectorView<unsigned_int>::empty
                                  (&(pSStack_330->array).super_VectorView<unsigned_int>);
                if (!bVar2) {
                  __assert_fail("type.array.empty()",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                                ,0x138d,
                                "void spirv_cross::CompilerMSL::ensure_member_packing_rules_msl(SPIRType &, uint32_t)"
                               );
                }
                *(undefined4 *)&(pSStack_330->super_IVariant).field_0xc = 0x1c;
                local_33c = 1;
                SmallVector<unsigned_int,_8UL>::push_back(&pSStack_330->array,&local_33c);
                local_33d = true;
                SmallVector<bool,_8UL>::push_back(&pSStack_330->array_size_literal,&local_33d);
              }
            }
            else {
              pSStack_330->columns = pSStack_330->columns - 1;
            }
          }
        }
        bVar2 = validate_member_packing_rules_msl(this,pSStack_18,mbr_type._4_4_);
        if (!bVar2) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar5,"Found a buffer packing case which we cannot represent in MSL.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::ensure_member_packing_rules_msl(SPIRType &ib_type, uint32_t index)
{
	if (validate_member_packing_rules_msl(ib_type, index))
		return;

	// We failed validation.
	// This case will be nightmare-ish to deal with. This could possibly happen if struct alignment does not quite
	// match up with what we want. Scalar block layout comes to mind here where we might have to work around the rule
	// that struct alignment == max alignment of all members and struct size depends on this alignment.
	// Can't repack structs, but can repack pointers to structs.
	auto &mbr_type = get<SPIRType>(ib_type.member_types[index]);
	bool is_buff_ptr = mbr_type.pointer && mbr_type.storage == StorageClassPhysicalStorageBuffer;
	if (mbr_type.basetype == SPIRType::Struct && !is_buff_ptr)
		SPIRV_CROSS_THROW("Cannot perform any repacking for structs when it is used as a member of another struct.");

	// Perform remapping here.
	// There is nothing to be gained by using packed scalars, so don't attempt it.
	if (!is_scalar(ib_type))
		set_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypePacked);

	// Try validating again, now with packed.
	if (validate_member_packing_rules_msl(ib_type, index))
		return;

	// We're in deep trouble, and we need to create a new PhysicalType which matches up with what we expect.
	// A lot of work goes here ...
	// We will need remapping on Load and Store to translate the types between Logical and Physical.

	// First, we check if we have small vector std140 array.
	// We detect this if we have an array of vectors, and array stride is greater than number of elements.
	if (!mbr_type.array.empty() && !is_matrix(mbr_type))
	{
		uint32_t array_stride = type_struct_member_array_stride(ib_type, index);

		// Hack off array-of-arrays until we find the array stride per element we must have to make it work.
		uint32_t dimensions = uint32_t(mbr_type.array.size() - 1);
		for (uint32_t dim = 0; dim < dimensions; dim++)
			array_stride /= max<uint32_t>(to_array_size_literal(mbr_type, dim), 1u);

		// Pointers are 8 bytes
		uint32_t mbr_width_in_bytes = is_buff_ptr ? 8 : (mbr_type.width / 8);
		uint32_t elems_per_stride = array_stride / mbr_width_in_bytes;

		if (elems_per_stride == 3)
			SPIRV_CROSS_THROW("Cannot use ArrayStride of 3 elements in remapping scenarios.");
		else if (elems_per_stride > 4 && elems_per_stride != 8)
			SPIRV_CROSS_THROW("Cannot represent vectors with more than 4 elements in MSL.");

		if (elems_per_stride == 8)
		{
			if (mbr_type.width == 16)
				add_spv_func_and_recompile(SPVFuncImplPaddedStd140);
			else
				SPIRV_CROSS_THROW("Unexpected type in std140 wide array resolve.");
		}

		auto physical_type = mbr_type;
		physical_type.vecsize = elems_per_stride;
		physical_type.parent_type = 0;

		// If this is a physical buffer pointer, replace type with a ulongn vector.
		if (is_buff_ptr)
		{
			physical_type.width = 64;
			physical_type.basetype = to_unsigned_basetype(physical_type.width);
			physical_type.pointer = false;
			physical_type.pointer_depth = false;
			physical_type.forward_pointer = false;
		}

		uint32_t type_id = ir.increase_bound_by(1);
		set<SPIRType>(type_id, physical_type);
		set_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypeID, type_id);
		set_decoration(type_id, DecorationArrayStride, array_stride);

		// Remove packed_ for vectors of size 1, 2 and 4.
		unset_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypePacked);
	}
	else if (is_matrix(mbr_type))
	{
		// MatrixStride might be std140-esque.
		uint32_t matrix_stride = type_struct_member_matrix_stride(ib_type, index);

		uint32_t elems_per_stride = matrix_stride / (mbr_type.width / 8);

		if (elems_per_stride == 3)
			SPIRV_CROSS_THROW("Cannot use ArrayStride of 3 elements in remapping scenarios.");
		else if (elems_per_stride > 4 && elems_per_stride != 8)
			SPIRV_CROSS_THROW("Cannot represent vectors with more than 4 elements in MSL.");

		if (elems_per_stride == 8)
		{
			if (mbr_type.basetype != SPIRType::Half)
				SPIRV_CROSS_THROW("Unexpected type in std140 wide matrix stride resolve.");
			add_spv_func_and_recompile(SPVFuncImplPaddedStd140);
		}

		bool row_major = has_member_decoration(ib_type.self, index, DecorationRowMajor);
		auto physical_type = mbr_type;
		physical_type.parent_type = 0;

		if (row_major)
			physical_type.columns = elems_per_stride;
		else
			physical_type.vecsize = elems_per_stride;
		uint32_t type_id = ir.increase_bound_by(1);
		set<SPIRType>(type_id, physical_type);
		set_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypeID, type_id);

		// Remove packed_ for vectors of size 1, 2 and 4.
		unset_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypePacked);
	}
	else
		SPIRV_CROSS_THROW("Found a buffer packing case which we cannot represent in MSL.");

	// Try validating again, now with physical type remapping.
	if (validate_member_packing_rules_msl(ib_type, index))
		return;

	// We might have a particular odd scalar layout case where the last element of an array
	// does not take up as much space as the ArrayStride or MatrixStride. This can happen with DX cbuffers.
	// The "proper" workaround for this is extremely painful and essentially impossible in the edge case of float3[],
	// so we hack around it by declaring the offending array or matrix with one less array size/col/row,
	// and rely on padding to get the correct value. We will technically access arrays out of bounds into the padding region,
	// but it should spill over gracefully without too much trouble. We rely on behavior like this for unsized arrays anyways.

	// E.g. we might observe a physical layout of:
	// { float2 a[2]; float b; } in cbuffer layout where ArrayStride of a is 16, but offset of b is 24, packed right after a[1] ...
	uint32_t type_id = get_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypeID);
	auto &type = get<SPIRType>(type_id);

	// Modify the physical type in-place. This is safe since each physical type workaround is a copy.
	if (is_array(type))
	{
		if (type.array.back() > 1)
		{
			if (!type.array_size_literal.back())
				SPIRV_CROSS_THROW("Cannot apply scalar layout workaround with spec constant array size.");
			type.array.back() -= 1;
		}
		else
		{
			// We have an array of size 1, so we cannot decrement that. Our only option now is to
			// force a packed layout instead, and drop the physical type remap since ArrayStride is meaningless now.
			unset_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypeID);
			set_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypePacked);
		}
	}
	else if (is_matrix(type))
	{
		bool row_major = has_member_decoration(ib_type.self, index, DecorationRowMajor);
		if (!row_major)
		{
			// Slice off one column. If we only have 2 columns, this might turn the matrix into a vector with one array element instead.
			if (type.columns > 2)
			{
				type.columns--;
			}
			else if (type.columns == 2)
			{
				type.columns = 1;
				assert(type.array.empty());
				type.op = OpTypeArray;
				type.array.push_back(1);
				type.array_size_literal.push_back(true);
			}
		}
		else
		{
			// Slice off one row. If we only have 2 rows, this might turn the matrix into a vector with one array element instead.
			if (type.vecsize > 2)
			{
				type.vecsize--;
			}
			else if (type.vecsize == 2)
			{
				type.vecsize = type.columns;
				type.columns = 1;
				assert(type.array.empty());
				type.op = OpTypeArray;
				type.array.push_back(1);
				type.array_size_literal.push_back(true);
			}
		}
	}

	// This better validate now, or we must fail gracefully.
	if (!validate_member_packing_rules_msl(ib_type, index))
		SPIRV_CROSS_THROW("Found a buffer packing case which we cannot represent in MSL.");
}